

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

void bcread_fill(LexState *ls,MSize len,int need)

{
  SBuf *sb;
  MSize sz_00;
  char *__src;
  char *pcVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sz;
  ulong local_38;
  
  if ((len < 0x7fffff01) && (-1 < ls->c)) {
    sb = &ls->sb;
    __src = ls->p;
    pcVar5 = ls->pe;
    while( true ) {
      pcVar1 = (ls->sb).b;
      uVar4 = (long)pcVar5 - (long)__src;
      iVar3 = (int)uVar4;
      if (iVar3 == 0) {
        uVar4 = 0;
      }
      else {
        if (*(int *)&sb->w == (int)pcVar1) {
          if ((uint)(*(int *)&(ls->sb).e - (int)pcVar1) < len) {
            pcVar1 = lj_buf_need2(sb,len);
            __src = ls->p;
          }
          memcpy(pcVar1,__src,uVar4 & 0xffffffff);
        }
        else if (__src != pcVar1) {
          memmove(pcVar1,__src,uVar4 & 0xffffffff);
        }
        uVar4 = uVar4 & 0xffffffff;
        ls->p = pcVar1;
        ls->pe = pcVar1 + uVar4;
      }
      (ls->sb).w = pcVar1 + uVar4;
      __src = (*ls->rfunc)(ls->L,ls->rdata,&local_38);
      if ((__src == (char *)0x0) || (local_38 == 0)) break;
      if (0x7fffff00 - iVar3 <= local_38) {
        lj_err_mem(ls->L);
      }
      if (iVar3 == 0) {
        ls->p = __src;
        pcVar5 = __src + local_38;
      }
      else {
        uVar2 = (int)local_38 + iVar3;
        sz_00 = len;
        if (len < uVar2) {
          sz_00 = uVar2;
        }
        pcVar1 = (ls->sb).b;
        if ((uint)(*(int *)&(ls->sb).e - (int)pcVar1) < sz_00) {
          pcVar1 = lj_buf_need2(sb,sz_00);
        }
        memcpy((ls->sb).w,__src,local_38);
        pcVar5 = pcVar1 + uVar2;
        (ls->sb).w = pcVar5;
        ls->p = pcVar1;
        __src = pcVar1;
      }
      ls->pe = pcVar5;
      if (len <= (uint)((int)pcVar5 - (int)__src)) {
        return;
      }
    }
    if (need == 0) {
      ls->c = -1;
      return;
    }
  }
  bcread_error((LexState *)ls->L,(ErrMsg)ls->chunkarg);
}

Assistant:

static LJ_NOINLINE void bcread_fill(LexState *ls, MSize len, int need)
{
  lj_assertLS(len != 0, "empty refill");
  if (len > LJ_MAX_BUF || ls->c < 0)
    bcread_error(ls, LJ_ERR_BCBAD);
  do {
    const char *buf;
    size_t sz;
    char *p = ls->sb.b;
    MSize n = (MSize)(ls->pe - ls->p);
    if (n) {  /* Copy remainder to buffer. */
      if (sbuflen(&ls->sb)) {  /* Move down in buffer. */
	lj_assertLS(ls->pe == ls->sb.w, "bad buffer pointer");
	if (ls->p != p) memmove(p, ls->p, n);
      } else {  /* Copy from buffer provided by reader. */
	p = lj_buf_need(&ls->sb, len);
	memcpy(p, ls->p, n);
      }
      ls->p = p;
      ls->pe = p + n;
    }
    ls->sb.w = p + n;
    buf = ls->rfunc(ls->L, ls->rdata, &sz);  /* Get more data from reader. */
    if (buf == NULL || sz == 0) {  /* EOF? */
      if (need) bcread_error(ls, LJ_ERR_BCBAD);
      ls->c = -1;  /* Only bad if we get called again. */
      break;
    }
    if (sz >= LJ_MAX_BUF - n) lj_err_mem(ls->L);
    if (n) {  /* Append to buffer. */
      n += (MSize)sz;
      p = lj_buf_need(&ls->sb, n < len ? len : n);
      memcpy(ls->sb.w, buf, sz);
      ls->sb.w = p + n;
      ls->p = p;
      ls->pe = p + n;
    } else {  /* Return buffer provided by reader. */
      ls->p = buf;
      ls->pe = buf + sz;
    }
  } while ((MSize)(ls->pe - ls->p) < len);
}